

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.h
# Opt level: O0

TInfoSinkBase * __thiscall glslang::TInfoSinkBase::operator<<(TInfoSinkBase *this,int n)

{
  int in_ECX;
  TString local_40;
  int local_14;
  TInfoSinkBase *pTStack_10;
  int n_local;
  TInfoSinkBase *this_local;
  
  local_14 = n;
  pTStack_10 = this;
  String_abi_cxx11_(&local_40,(glslang *)(ulong)(uint)n,10,in_ECX);
  append(this,&local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_40);
  return this;
}

Assistant:

TInfoSinkBase& operator<<(int n)                   { append(String(n)); return *this; }